

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O3

void __thiscall
Liby::PollerEpoll::updateChanel(PollerEpoll *this,Channel *ch,bool readable,bool writable)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  char *pcVar4;
  uint32_t local_14;
  int local_10;
  
  if ((ch != (Channel *)0x0) && (local_10 = ch->fd_, -1 < local_10)) {
    local_14 = (uint)readable + (uint)writable * 4 + 0x2010;
    iVar1 = epoll_ctl(this->pollerfd_,3,local_10,(epoll_event *)&local_14);
    if (-1 < iVar1) {
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    *puVar2 = pcVar4;
    __cxa_throw(puVar2,&char*::typeinfo,0);
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                ,0x5a,"virtual void Liby::PollerEpoll::updateChanel(Channel *, bool, bool)");
}

Assistant:

void PollerEpoll::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct epoll_event event;
    event.data.fd = fd;
    event.events = EPOLLHUP | EPOLLRDHUP;

    if (readable) {
        event.events |= EPOLLIN;
    }

    if (writable) {
        event.events |= EPOLLOUT;
    }

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_MOD, fd, &event);

    if (ret < 0) {
        throw ::strerror(errno);
    }
}